

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int vcf_format(bcf_hdr_t *h,bcf1_t *v,kstring_t *s)

{
  int n;
  float fVar1;
  char *pcVar2;
  bcf_info_t *pbVar3;
  bcf_fmt_t *pbVar4;
  uint8_t *puVar5;
  bool bVar6;
  byte bVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  char *p;
  bcf_fmt_t *pbVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  
  bcf_unpack(v,0xf);
  kputs(h->id[1][v->rid].key,s);
  kputc(9,s);
  kputw(v->pos + 1,s);
  kputc(9,s);
  pcVar2 = (v->d).id;
  p = ".";
  if (pcVar2 != (char *)0x0) {
    p = pcVar2;
  }
  kputs(p,s);
  kputc(9,s);
  if (*(short *)&v->field_0x12 == 0) {
    kputc(0x2e,s);
  }
  else {
    kputs(*(v->d).allele,s);
  }
  kputc(9,s);
  uVar16 = *(ulong *)&v->field_0x10;
  if ((uVar16 & 0xfffe0000) == 0) {
    kputc(0x2e,s);
  }
  else {
    for (uVar13 = 1; uVar13 < (uVar16 >> 0x10 & 0xffff); uVar13 = uVar13 + 1) {
      if (1 < uVar13) {
        kputc(0x2c,s);
      }
      kputs((v->d).allele[uVar13],s);
      uVar16 = *(ulong *)&v->field_0x10;
    }
  }
  kputc(9,s);
  if ((float)bcf_float_missing == v->qual) {
    kputc(0x2e,s);
  }
  else {
    ksprintf(s,"%g",(double)v->qual);
  }
  kputc(9,s);
  iVar9 = (v->d).n_flt;
  if (iVar9 == 0) {
    kputc(0x2e,s);
  }
  else {
    for (lVar14 = 0; lVar14 < iVar9; lVar14 = lVar14 + 1) {
      if (lVar14 != 0) {
        kputc(0x3b,s);
      }
      kputs(h->id[0][(v->d).flt[lVar14]].key,s);
      iVar9 = (v->d).n_flt;
    }
  }
  kputc(9,s);
  uVar16 = (ulong)*(ushort *)&v->field_0x10;
  if (uVar16 != 0) {
    bVar6 = true;
    lVar14 = 0x10;
    for (uVar13 = 0; uVar13 < uVar16; uVar13 = uVar13 + 1) {
      pbVar3 = (v->d).info;
      if (*(long *)((long)&pbVar3->key + lVar14) == 0) goto LAB_00119d4e;
      if (!bVar6) {
        kputc(0x3b,s);
      }
      kputs(h->id[0][*(int *)((long)pbVar3 + lVar14 + -0x10)].key,s);
      bVar6 = false;
      if (*(int *)((long)pbVar3 + lVar14 + -8) < 1) goto LAB_00119d4e;
      kputc(0x3d,s);
      iVar9 = *(int *)((long)pbVar3 + lVar14 + -0xc);
      n = *(int *)((long)pbVar3 + lVar14 + -8);
      if (n != 1) {
        bcf_fmt_array(s,n,iVar9,*(void **)((long)&pbVar3->key + lVar14));
        goto LAB_00119d4e;
      }
      switch(iVar9) {
      case 1:
        iVar9 = *(int *)((long)pbVar3 + lVar14 + -4);
        if (iVar9 != -0x80) goto LAB_00119d46;
LAB_00119d39:
        iVar9 = 0x2e;
        break;
      case 2:
        iVar9 = *(int *)((long)pbVar3 + lVar14 + -4);
        if (iVar9 == -0x8000) goto LAB_00119d39;
        goto LAB_00119d46;
      case 3:
        iVar9 = *(int *)((long)pbVar3 + lVar14 + -4);
LAB_00119d46:
        kputw(iVar9,s);
        bVar6 = false;
        goto LAB_00119d4e;
      default:
        fprintf(_stderr,"todo: type %d\n");
        exit(1);
      case 5:
        fVar1 = *(float *)((long)pbVar3 + lVar14 + -4);
        if ((float)bcf_float_missing == fVar1) goto LAB_00119d39;
        ksprintf(s,"%g",(double)fVar1);
        bVar6 = false;
        goto LAB_00119d4e;
      case 7:
        iVar9 = *(int *)((long)pbVar3 + lVar14 + -4);
      }
      kputc(iVar9,s);
LAB_00119d4e:
      uVar16 = (ulong)*(ushort *)&v->field_0x10;
      lVar14 = lVar14 + 0x20;
    }
    if (!bVar6) goto LAB_00119d75;
  }
  kputc(0x2e,s);
LAB_00119d75:
  uVar16 = *(ulong *)&v->field_0x10;
  if (uVar16 >> 0x28 != 0) {
    if ((char)(uVar16 >> 0x20) == '\0') {
      for (uVar10 = 0; uVar10 <= (uint)(uVar16 >> 0x28); uVar10 = uVar10 + 1) {
        kputs("\t.",s);
        uVar16 = *(ulong *)&v->field_0x10;
      }
    }
    else {
      pbVar4 = (v->d).fmt;
      bVar6 = true;
      uVar13 = 0xffffffffffffffff;
      pbVar12 = pbVar4;
      for (uVar15 = 0; uVar15 < (uVar16 >> 0x20 & 0xff); uVar15 = uVar15 + 1) {
        if (pbVar12->p != (uint8_t *)0x0) {
          iVar9 = 9;
          if (!bVar6) {
            iVar9 = 0x3a;
          }
          kputc(iVar9,s);
          if ((long)pbVar12->id < 0) {
            fprintf(_stderr,"[E::%s] invalid BCF, the FORMAT tag id=%d not present in the header.\n"
                    ,"vcf_format");
            abort();
          }
          kputs(h->id[0][pbVar12->id].key,s);
          pcVar2 = h->id[0][pbVar12->id].key;
          if (((*pcVar2 == 'G') && (pcVar2[1] == 'T')) &&
             (uVar13 = uVar13 & 0xffffffff, pcVar2[2] == '\0')) {
            uVar13 = uVar15 & 0xffffffff;
          }
          uVar16 = *(ulong *)&v->field_0x10;
          bVar6 = false;
        }
        pbVar12 = pbVar12 + 1;
      }
      if (bVar6) {
        kputs("\t.",s);
      }
      for (uVar10 = 0; uVar10 < (uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x28);
          uVar10 = uVar10 + 1) {
        kputc(9,s);
        bVar6 = true;
        for (uVar16 = 0; uVar16 < (byte)v->field_0x14; uVar16 = uVar16 + 1) {
          if (pbVar4[uVar16].p != (uint8_t *)0x0) {
            if (!bVar6) {
              kputc(0x3a,s);
            }
            if (uVar16 == (uVar13 & 0xffffffff)) {
              iVar9 = pbVar4[uVar16].type;
              if (iVar9 == 3) {
                iVar9 = pbVar4[uVar16].size * uVar10;
                puVar5 = pbVar4[uVar16].p;
                lVar14 = 0;
                while ((lVar14 < pbVar4[uVar16].n &&
                       (uVar11 = *(uint *)(puVar5 + lVar14 * 4 + (long)iVar9), uVar11 != 0x80000001)
                       )) {
                  if (lVar14 != 0) {
                    kputc((int)"/|"[uVar11 & 1],s);
                    uVar11 = *(uint *)(puVar5 + lVar14 * 4 + (long)iVar9);
                  }
                  if (uVar11 < 2) {
                    kputc(0x2e,s);
                  }
                  else {
                    kputw(((int)uVar11 >> 1) + -1,s);
                  }
                  lVar14 = lVar14 + 1;
                }
              }
              else if (iVar9 == 2) {
                iVar9 = pbVar4[uVar16].size * uVar10;
                puVar5 = pbVar4[uVar16].p;
                lVar14 = 0;
                while ((lVar14 < pbVar4[uVar16].n &&
                       (uVar8 = *(ushort *)(puVar5 + lVar14 * 2 + (long)iVar9), uVar8 != 0x8001))) {
                  if (lVar14 != 0) {
                    kputc((int)"/|"[uVar8 & 1],s);
                    uVar8 = *(ushort *)(puVar5 + lVar14 * 2 + (long)iVar9);
                  }
                  if (uVar8 < 2) {
                    kputc(0x2e,s);
                  }
                  else {
                    kputw((int)(short)(((short)uVar8 >> 1) + -1),s);
                  }
                  lVar14 = lVar14 + 1;
                }
              }
              else {
                if (iVar9 != 1) {
                  fprintf(_stderr,"FIXME: type %d in bcf_format_gt?\n");
                  abort();
                }
                iVar9 = pbVar4[uVar16].size * uVar10;
                puVar5 = pbVar4[uVar16].p;
                for (lVar14 = 0;
                    (lVar14 < pbVar4[uVar16].n && (bVar7 = puVar5[lVar14 + iVar9], bVar7 != 0x81));
                    lVar14 = lVar14 + 1) {
                  if (lVar14 != 0) {
                    kputc((int)"/|"[bVar7 & 1],s);
                    bVar7 = puVar5[lVar14 + iVar9];
                  }
                  if (bVar7 < 2) {
                    kputc(0x2e,s);
                  }
                  else {
                    kputw((int)(char)(((char)bVar7 >> 1) + -1),s);
                  }
                }
              }
              if (lVar14 == 0) {
                kputc(0x2e,s);
              }
              bVar6 = false;
            }
            else {
              bcf_fmt_array(s,pbVar4[uVar16].n,pbVar4[uVar16].type,
                            pbVar4[uVar16].p + (long)(int)uVar10 * (long)pbVar4[uVar16].size);
              bVar6 = false;
            }
          }
        }
        if (bVar6) {
          kputc(0x2e,s);
        }
      }
    }
  }
  kputc(10,s);
  return 0;
}

Assistant:

int vcf_format(const bcf_hdr_t *h, const bcf1_t *v, kstring_t *s)
{
    int i;
    bcf_unpack((bcf1_t*)v, BCF_UN_ALL);
    kputs(h->id[BCF_DT_CTG][v->rid].key, s); // CHROM
    kputc('\t', s); kputw(v->pos + 1, s); // POS
    kputc('\t', s); kputs(v->d.id ? v->d.id : ".", s); // ID
    kputc('\t', s); // REF
    if (v->n_allele > 0) kputs(v->d.allele[0], s);
    else kputc('.', s);
    kputc('\t', s); // ALT
    if (v->n_allele > 1) {
        for (i = 1; i < v->n_allele; ++i) {
            if (i > 1) kputc(',', s);
            kputs(v->d.allele[i], s);
        }
    } else kputc('.', s);
    kputc('\t', s); // QUAL
    if ( bcf_float_is_missing(v->qual) ) kputc('.', s); // QUAL
    else ksprintf(s, "%g", v->qual);
    kputc('\t', s); // FILTER
    if (v->d.n_flt) {
        for (i = 0; i < v->d.n_flt; ++i) {
            if (i) kputc(';', s);
            kputs(h->id[BCF_DT_ID][v->d.flt[i]].key, s);
        }
    } else kputc('.', s);
    kputc('\t', s); // INFO
    if (v->n_info) {
        int first = 1;
        for (i = 0; i < v->n_info; ++i) {
            bcf_info_t *z = &v->d.info[i];
            if ( !z->vptr ) continue;
            if ( !first ) kputc(';', s); first = 0;
            kputs(h->id[BCF_DT_ID][z->key].key, s);
            if (z->len <= 0) continue;
            kputc('=', s);
            if (z->len == 1) 
            {
                switch (z->type) 
                {
                    case BCF_BT_INT8:  if ( z->v1.i==bcf_int8_missing ) kputc('.', s); else kputw(z->v1.i, s); break;
                    case BCF_BT_INT16: if ( z->v1.i==bcf_int16_missing ) kputc('.', s); else kputw(z->v1.i, s); break;
                    case BCF_BT_INT32: if ( z->v1.i==bcf_int32_missing ) kputc('.', s); else kputw(z->v1.i, s); break;
                    case BCF_BT_FLOAT: if ( bcf_float_is_missing(z->v1.f) ) kputc('.', s); else ksprintf(s, "%g", z->v1.f); break;
                    case BCF_BT_CHAR:  kputc(z->v1.i, s); break;
                    default: fprintf(stderr,"todo: type %d\n", z->type); exit(1); break;
                }
            }
            else bcf_fmt_array(s, z->len, z->type, z->vptr);
        }
        if ( first ) kputc('.', s);
    } else kputc('.', s);
    // FORMAT and individual information
    if (v->n_sample)
    {
        int i,j;
        if ( v->n_fmt)
        {
            int gt_i = -1;
            bcf_fmt_t *fmt = v->d.fmt;
            int first = 1;
            for (i = 0; i < (int)v->n_fmt; ++i) {
                if ( !fmt[i].p ) continue;
                kputc(!first ? ':' : '\t', s); first = 0;
                if ( fmt[i].id<0 ) //!bcf_hdr_idinfo_exists(h,BCF_HL_FMT,fmt[i].id) )
                {
                    fprintf(stderr, "[E::%s] invalid BCF, the FORMAT tag id=%d not present in the header.\n", __func__, fmt[i].id);
                    abort();
                }
                kputs(h->id[BCF_DT_ID][fmt[i].id].key, s);
                if (strcmp(h->id[BCF_DT_ID][fmt[i].id].key, "GT") == 0) gt_i = i;
            }
            if ( first ) kputs("\t.", s);
            for (j = 0; j < v->n_sample; ++j) {
                kputc('\t', s);
                first = 1;
                for (i = 0; i < (int)v->n_fmt; ++i) {
                    bcf_fmt_t *f = &fmt[i];
                    if ( !f->p ) continue;
                    if (!first) kputc(':', s); first = 0;
                    if (gt_i == i)
                        bcf_format_gt(f,j,s);
                    else
                        bcf_fmt_array(s, f->n, f->type, f->p + j * f->size);
                }
                if ( first ) kputc('.', s);
            }
        }
        else
            for (j=0; j<=v->n_sample; j++)
                kputs("\t.", s);
    }
    kputc('\n', s);
    return 0;
}